

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O1

void EvpathPreloadHandler
               (CManager cm,CMConnection conn,void *msg_v,void *client_Data,attr_list attrs)

{
  undefined4 uVar1;
  Evpath_RS_Stream RS_Stream;
  code *pcVar2;
  void *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t sVar6;
  SstStats p_Var7;
  _EvpathCompletionHandle *p_Var8;
  _EvpathCompletionHandle *p_Var9;
  int iVar10;
  _RSTimestepEntry *p_Var11;
  uint64_t uVar12;
  _EvpathCompletionHandle **pp_Var13;
  _EvpathCompletionHandle *p_Var14;
  _EvpathCompletionHandle *p_Var15;
  undefined1 auVar16 [16];
  
  RS_Stream = *(Evpath_RS_Stream *)((long)msg_v + 0x18);
  p_Var11 = (_RSTimestepEntry *)calloc(1,0x30);
  pcVar2 = *client_Data;
  pvVar3 = RS_Stream->CP_Stream;
  uVar1 = *(undefined4 *)((long)msg_v + 0x10);
  uVar4 = *msg_v;
  uVar12 = writeBlockFingerprint(*(char **)((long)msg_v + 0x20),*(size_t *)((long)msg_v + 8));
  (*pcVar2)(pvVar3,3,"Got a preload message from writer rank %d for timestep %ld, fprint %lx\n",
            uVar1,uVar4,uVar12);
  CMtake_buffer(cm,msg_v);
  uVar5 = *msg_v;
  p_Var11->Timestep = uVar5;
  p_Var11->WriterRank = *(int *)((long)msg_v + 0x10);
  p_Var11->Data = *(char **)((long)msg_v + 0x20);
  sVar6 = *(size_t *)((long)msg_v + 8);
  p_Var11->DataSize = sVar6;
  p_Var11->DataStart = 0;
  p_Var7 = RS_Stream->Stats;
  auVar16._8_4_ = (int)sVar6;
  auVar16._0_8_ = sVar6;
  auVar16._12_4_ = (int)(sVar6 >> 0x20);
  p_Var7->DataBytesReceived = sVar6 + p_Var7->DataBytesReceived;
  p_Var7->PreloadBytesReceived = auVar16._8_8_ + p_Var7->PreloadBytesReceived;
  if (RS_Stream->LastPreloadTimestep < uVar5) {
    RS_Stream->LastPreloadTimestep = uVar5;
    p_Var7->PreloadTimestepsReceived = p_Var7->PreloadTimestepsReceived + 1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&RS_Stream->DataLock);
  p_Var11->Next = RS_Stream->QueuedTimesteps;
  RS_Stream->QueuedTimesteps = p_Var11;
  if (RS_Stream->PendingReadRequests != (_EvpathCompletionHandle *)0x0) {
    p_Var15 = RS_Stream->PendingReadRequests;
    do {
      p_Var8 = p_Var15->Next;
      iVar10 = HandleRequestWithPreloaded
                         ((CP_Services)client_Data,RS_Stream,p_Var15->Rank,*msg_v,p_Var15->Offset,
                          p_Var15->Length,p_Var15->Buffer);
      if (iVar10 != 0) {
        CMCondition_signal(cm,p_Var15->CMcondition);
        p_Var9 = RS_Stream->PendingReadRequests;
        pp_Var13 = &RS_Stream->PendingReadRequests;
        if (p_Var9 != p_Var15) {
          do {
            p_Var14 = p_Var9;
            if (p_Var14 == (_EvpathCompletionHandle *)0x0) goto LAB_00738ea1;
            p_Var9 = p_Var14->Next;
          } while (p_Var9 != p_Var15);
          pp_Var13 = &p_Var14->Next;
          p_Var15 = p_Var9;
        }
        *pp_Var13 = p_Var15->Next;
      }
LAB_00738ea1:
      p_Var15 = p_Var8;
    } while (p_Var8 != (_EvpathCompletionHandle *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&RS_Stream->DataLock);
  return;
}

Assistant:

static void EvpathPreloadHandler(CManager cm, CMConnection conn, void *msg_v, void *client_Data,
                                 attr_list attrs)
{
    EvpathPreloadMsg PreloadMsg = (EvpathPreloadMsg)msg_v;
    Evpath_RS_Stream RS_Stream = PreloadMsg->RS_Stream;
    CP_Services Svcs = (CP_Services)client_Data;
    RSTimestepList Entry = calloc(1, sizeof(*Entry));

    Svcs->verbose(RS_Stream->CP_Stream, DPPerStepVerbose,
                  "Got a preload message from writer rank %d for timestep %ld, fprint "
                  "%lx\n",
                  PreloadMsg->WriterRank, PreloadMsg->Timestep,
                  writeBlockFingerprint(PreloadMsg->Data, PreloadMsg->DataLength));
    /* arrange for this message data to stay around */
    CMtake_buffer(cm, msg_v);

    Entry->Timestep = PreloadMsg->Timestep;
    Entry->WriterRank = PreloadMsg->WriterRank;
    Entry->Data = PreloadMsg->Data;
    Entry->DataSize = PreloadMsg->DataLength;
    Entry->DataStart = 0;
    RS_Stream->Stats->DataBytesReceived += PreloadMsg->DataLength;
    RS_Stream->Stats->PreloadBytesReceived += PreloadMsg->DataLength;
    if (PreloadMsg->Timestep > RS_Stream->LastPreloadTimestep)
    {
        // only incremenet PreloadTimesteps once, even if we get multiple
        // preloads on a timestep (from different ranks)
        RS_Stream->LastPreloadTimestep = PreloadMsg->Timestep;
        RS_Stream->Stats->PreloadTimestepsReceived++;
    }
    pthread_mutex_lock(&RS_Stream->DataLock);
    Entry->Next = RS_Stream->QueuedTimesteps;
    RS_Stream->QueuedTimesteps = Entry;
    EvpathCompletionHandle Requests = RS_Stream->PendingReadRequests;
    while (Requests)
    {
        int HadPreload;
        EvpathCompletionHandle Next = Requests->Next;
        HadPreload =
            HandleRequestWithPreloaded(Svcs, RS_Stream, Requests->Rank, PreloadMsg->Timestep,
                                       Requests->Offset, Requests->Length, Requests->Buffer);
        if (HadPreload)
        {
            CMCondition_signal(cm, Requests->CMcondition);
            RemoveRequestFromList(Svcs, RS_Stream, Requests);
        }
        Requests = Next;
    }
    pthread_mutex_unlock(&RS_Stream->DataLock);
    return;
}